

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
recoverKey(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *password,vector<unsigned_char,_std::allocator<unsigned_char>_> *protectedKey)

{
  pointer puVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  undefined8 *puVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  size_type __n;
  ulong uVar12;
  undefined1 local_140 [8];
  SHA_CTX context;
  vector<unsigned_char,_std::allocator<unsigned_char>_> salt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encrKey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> xorKey;
  undefined8 uStack_78;
  uint8_t digest [20];
  vector<unsigned_char,_std::allocator<unsigned_char>_> passwdBytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *plainKey;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(digest + 0x10),
             password->_M_string_length * 2,(allocator_type *)local_140);
  uVar6 = 1;
  for (uVar8 = 0; (ulong)uVar8 < password->_M_string_length; uVar8 = uVar8 + 1) {
    *(undefined1 *)((long)stack0xffffffffffffffa0 + (ulong)(uVar6 - 1)) = 0;
    *(char *)((long)stack0xffffffffffffffa0 + (ulong)uVar6) = (password->_M_dataplus)._M_p[uVar8];
    uVar6 = uVar6 + 2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(context.data + 0xf),0x14,
             (allocator_type *)local_140);
  puVar1 = (protectedKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
           .super__Vector_impl_data._M_start;
  *(undefined4 *)(context._88_8_ + 0x10) = *(undefined4 *)(puVar1 + 0x10);
  uVar3 = *(undefined8 *)(puVar1 + 8);
  *(undefined8 *)context._88_8_ = *(undefined8 *)puVar1;
  *(undefined8 *)(context._88_8_ + 8) = uVar3;
  iVar2 = (int)(protectedKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish -
          (int)(protectedKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
  uVar8 = iVar2 - 0x28;
  uVar6 = ((int)uVar8 / 0x14 + 1) - (uint)((int)uVar8 % 0x14 == 0);
  __n = (size_type)(int)uVar8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__n,(allocator_type *)local_140);
  memcpy(salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage,
         (protectedKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start + 0x14,__n);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__n,(allocator_type *)local_140);
  SHA1_Init((SHA_CTX *)local_140);
  uStack_78 = *(undefined8 *)context._88_8_;
  digest._0_8_ = *(undefined8 *)(context._88_8_ + 8);
  digest._8_4_ = *(undefined4 *)(context._88_8_ + 0x10);
  plainKey._0_4_ = uVar6 - 1;
  uVar12 = 0;
  uVar11 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar11 = uVar12;
  }
  lVar10 = 0;
  for (iVar9 = 0;
      xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (int)uVar11,
      (int)xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage != iVar9; iVar9 = iVar9 + 1) {
    SHA1_Update((SHA_CTX *)local_140,stack0xffffffffffffffa0,
                (long)passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)stack0xffffffffffffffa0);
    SHA1_Update((SHA_CTX *)local_140,&uStack_78,0x14);
    SHA1_Final((uchar *)&uStack_78,(SHA_CTX *)local_140);
    SHA1_Init((SHA_CTX *)local_140);
    puVar1 = encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar10;
    if (iVar9 < (int)plainKey) {
      *(undefined4 *)(puVar1 + 0x10) = digest._8_4_;
      *(undefined8 *)puVar1 = uStack_78;
      *(undefined8 *)(puVar1 + 8) = digest._0_8_;
    }
    else {
      memcpy(puVar1,&uStack_78,
             (size_t)(xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                     (uVar12 - (long)encrKey.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)));
    }
    lVar10 = lVar10 + 0x14;
    uVar12 = uVar12 - 0x14;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)((long)&plainKey + 7));
  uVar12 = 0;
  uVar11 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar11 = uVar12;
  }
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[uVar12] =
         encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage[uVar12] ^
         salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage[uVar12];
  }
  SHA1_Update((SHA_CTX *)local_140,stack0xffffffffffffffa0,
              (long)passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)stack0xffffffffffffffa0);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  SHA1_Update((SHA_CTX *)local_140,puVar1,
              (long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1);
  SHA1_Final((uchar *)&uStack_78,(SHA_CTX *)local_140);
  lVar10 = 0;
  do {
    if (lVar10 == 0x14) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &salt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(context.data + 0xf)
                );
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(digest + 0x10));
      return __return_storage_ptr__;
    }
    lVar4 = lVar10 + -8;
    lVar5 = lVar10 + (iVar2 + -0x14);
    lVar10 = lVar10 + 1;
  } while (digest[lVar4] ==
           (protectedKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
           .super__Vector_impl_data._M_start[lVar5]);
  puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar7 = &PTR__exception_001b5a98;
  puVar7[1] = "Key password incorrect";
  __cxa_throw(puVar7,&key_exception::typeinfo,std::exception::~exception);
}

Assistant:

std::vector<uint8_t> recoverKey(const std::string& password,
                                const std::vector<uint8_t>& protectedKey)
{
    std::vector<uint8_t> passwdBytes(password.length() * 2);
    for (unsigned i = 0, j = 0; i < password.length(); i++) {
        passwdBytes[j++] = 0;
        passwdBytes[j++] = (uint8_t)password[i];
    }

    // Get the salt associated with this key (the first SALT_LEN bytes
    // protectedKey
    std::vector<uint8_t> salt(SALT_LEN);
    arraycopy8(protectedKey, 0, salt, 0, SALT_LEN);

    // Determine the number of digest rounds
    int encrKeyLen = protectedKey.size() - SALT_LEN - DIGEST_LEN;
    int numRounds = encrKeyLen / DIGEST_LEN;
    if ((encrKeyLen % DIGEST_LEN) != 0)
        numRounds++;

    // Get the encrypted key portion and store it in "encrKey"
    std::vector<uint8_t> encrKey(encrKeyLen);
    arraycopy8(protectedKey, SALT_LEN, encrKey, 0, encrKeyLen);

    // Set up the uint8_t array which will be XORed with "encrKey"
    std::vector<uint8_t> xorKey(encrKeyLen);

    SHA_CTX context;
    SHA1_Init(&context);

    uint8_t digest[DIGEST_LEN];
    arraycopy8(salt, 0, digest, 0, DIGEST_LEN);

    // Compute the digests, and store them in "xorKey"
    for (int i = 0, xorOffset = 0; i < numRounds;
         i++, xorOffset += DIGEST_LEN) {
        SHA1_Update(&context, &passwdBytes[0], passwdBytes.size());
        SHA1_Update(&context, &digest[0], DIGEST_LEN);
        SHA1_Final(&digest[0], &context);
        SHA1_Init(&context);
        // Copy the digest into "xorKey"
        if (i < numRounds - 1) {
            arraycopy8(digest, 0, xorKey, xorOffset, DIGEST_LEN);
        } else {
            arraycopy8(digest, 0, xorKey, xorOffset, xorKey.size() - xorOffset);
        }
    }

    // XOR "encrKey" with "xorKey", and store the result in "plainKey"
    std::vector<uint8_t> plainKey(encrKeyLen);
    for (int i = 0; i < encrKeyLen; i++) {
        plainKey[i] = (uint8_t)(encrKey[i] ^ xorKey[i]);
    }

    // Check the integrity of the recovered key by concatenating it with
    // the password, digesting the concatenation, and comparing the
    // result of the digest operation with the digest provided at the end
    // of 'protectedKey'. If the two digest values are
    // different, throw an exception.
    SHA1_Update(&context, &passwdBytes[0], passwdBytes.size());
    SHA1_Update(&context, &plainKey[0], plainKey.size());
    SHA1_Final(&digest[0], &context);

    for (int i = 0; i < DIGEST_LEN; i++) {
        if (digest[i] != protectedKey[SALT_LEN + encrKeyLen + i]) {
            throw key_exception("Key password incorrect");
        }
    }

    return plainKey;
}